

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_Init(char *mainPath,size_t maxDepth)

{
  size_t sVar1;
  uint32_t uVar2;
  LexerState *state_00;
  char *pcVar3;
  size_t sVar4;
  Context *pCVar5;
  FileStackNode *pFVar6;
  int *piVar7;
  FileStackNamedNode *fileInfo;
  Context *context;
  size_t len;
  char *fileName;
  LexerState *state;
  size_t maxDepth_local;
  char *mainPath_local;
  
  state_00 = lexer_OpenFile(mainPath);
  if (state_00 == (LexerState *)0x0) {
    fatalerror("Failed to open main file\n");
  }
  lexer_SetState(state_00);
  pcVar3 = lexer_GetFileName();
  sVar4 = strlen(pcVar3);
  pCVar5 = (Context *)malloc(0x40);
  pFVar6 = (FileStackNode *)malloc(sVar4 + 0x29);
  if (pCVar5 != (Context *)0x0) {
    if (pFVar6 != (FileStackNode *)0x0) {
      pCVar5->fileInfo = pFVar6;
      pCVar5->fileInfo->parent = (FileStackNode *)0x0;
      pCVar5->fileInfo->lineNo = 0;
      pCVar5->fileInfo->referenced = false;
      pCVar5->fileInfo->type = NODE_FILE;
      memcpy(pFVar6 + 1,pcVar3,sVar4 + 1);
      pCVar5->parent = (Context *)0x0;
      pCVar5->lexerState = state_00;
      uVar2 = macro_UndefUniqueID();
      pCVar5->uniqueID = uVar2;
      pCVar5->nbReptIters = 0;
      pCVar5->forValue = 0;
      pCVar5->forStep = 0;
      pCVar5->forName = (char *)0x0;
      sVar1 = maxDepth;
      contextStack = pCVar5;
      if (0x3ffffffffffffff3 < maxDepth) {
        error("Recursion depth may not be higher than %zu, defaulting to 64\n",0x3ffffffffffffff3);
        maxRecursionDepth = 0x40;
        sVar1 = maxRecursionDepth;
      }
      maxRecursionDepth = sVar1;
      runPreIncludeFile();
      return;
    }
    piVar7 = __errno_location();
    pcVar3 = strerror(*piVar7);
    fatalerror("Failed to allocate memory for main file info: %s\n",pcVar3);
  }
  piVar7 = __errno_location();
  pcVar3 = strerror(*piVar7);
  fatalerror("Failed to allocate memory for main context: %s\n",pcVar3);
}

Assistant:

void fstk_Init(char const *mainPath, size_t maxDepth)
{
	struct LexerState *state = lexer_OpenFile(mainPath);

	if (!state)
		fatalerror("Failed to open main file\n");
	lexer_SetState(state);
	char const *fileName = lexer_GetFileName();
	size_t len = strlen(fileName);
	struct Context *context = (struct Context *)malloc(sizeof(*contextStack));
	struct FileStackNamedNode *fileInfo =
		(struct FileStackNamedNode *)malloc(sizeof(*fileInfo) + len + 1);

	if (!context)
		fatalerror("Failed to allocate memory for main context: %s\n", strerror(errno));
	if (!fileInfo)
		fatalerror("Failed to allocate memory for main file info: %s\n", strerror(errno));

	context->fileInfo = (struct FileStackNode *)fileInfo;
	// lineNo and reptIter are unused on the top-level context
	context->fileInfo->parent = NULL;
	context->fileInfo->lineNo = 0; // This still gets written to the object file, so init it
	context->fileInfo->referenced = false;
	context->fileInfo->type = NODE_FILE;
	memcpy(fileInfo->name, fileName, len + 1);

	context->parent = NULL;
	context->lexerState = state;
	context->uniqueID = macro_UndefUniqueID();
	context->nbReptIters = 0;
	context->forValue = 0;
	context->forStep = 0;
	context->forName = NULL;

	// Now that it's set up properly, register the context
	contextStack = context;

	// Check that max recursion depth won't allow overflowing node `malloc`s
	// This assumes that the rept node is larger
#define DEPTH_LIMIT ((SIZE_MAX - sizeof(struct FileStackReptNode)) / sizeof(uint32_t))
	if (maxDepth > DEPTH_LIMIT) {
		error("Recursion depth may not be higher than %zu, defaulting to "
		      EXPAND_AND_STR(DEFAULT_MAX_DEPTH) "\n", DEPTH_LIMIT);
		maxRecursionDepth = DEFAULT_MAX_DEPTH;
	} else {
		maxRecursionDepth = maxDepth;
	}
	// Make sure that the default of 64 is OK, though
	assert(DEPTH_LIMIT >= DEFAULT_MAX_DEPTH);
#undef DEPTH_LIMIT

	runPreIncludeFile();
}